

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyOSUtilRandomSeed(void *pBuf,sxu32 nLen,void *pUnused)

{
  sxu32 nLen_00;
  int __fd;
  ssize_t sVar1;
  __pid_t local_34;
  int fd;
  pid_t pid;
  char *zBuf;
  void *pUnused_local;
  void *pvStack_18;
  sxu32 nLen_local;
  void *pBuf_local;
  
  zBuf = (char *)0x0;
  _fd = pBuf;
  pUnused_local._4_4_ = nLen;
  pvStack_18 = pBuf;
  __fd = open("/dev/urandom",0);
  if (-1 < __fd) {
    sVar1 = read(__fd,_fd,(ulong)pUnused_local._4_4_);
    if (0 < sVar1) {
      close(__fd);
      return 0;
    }
    close(__fd);
  }
  local_34 = getpid();
  nLen_00 = pUnused_local._4_4_;
  if (3 < pUnused_local._4_4_) {
    nLen_00 = 4;
  }
  SyMemcpy(&local_34,_fd,nLen_00);
  if (0xf < (long)((ulong)pUnused_local._4_4_ - 4)) {
    gettimeofday((timeval *)((long)_fd + 4),(__timezone_ptr_t)0x0);
  }
  return 0;
}

Assistant:

static sxi32 SyOSUtilRandomSeed(void *pBuf, sxu32 nLen, void *pUnused)
{
	char *zBuf = (char *)pBuf;
#ifdef __WINNT__
	DWORD nProcessID; /* Yes, keep it uninitialized when compiling using the MinGW32 builds tools */
#elif defined(__UNIXES__)
	pid_t pid;
	int fd;
#else
	char zGarbage[128]; /* Yes, keep this buffer uninitialized */
#endif
	SXUNUSED(pUnused);
#ifdef __WINNT__
#ifndef __MINGW32__
	nProcessID = GetProcessId(GetCurrentProcess());
#endif
	SyMemcpy((const void *)&nProcessID, zBuf, SXMIN(nLen, sizeof(DWORD)));
	if( (sxu32)(&zBuf[nLen] - &zBuf[sizeof(DWORD)]) >= sizeof(SYSTEMTIME)  ){
		GetSystemTime((LPSYSTEMTIME)&zBuf[sizeof(DWORD)]);
	}
#elif defined(__UNIXES__)
	fd = open("/dev/urandom", O_RDONLY);
	if (fd >= 0 ){
		if( read(fd, zBuf, nLen) > 0 ){
			close(fd);
			return SXRET_OK;
		}
		/* FALL THRU */
		close(fd);
	}
	pid = getpid();
	SyMemcpy((const void *)&pid, zBuf, SXMIN(nLen, sizeof(pid_t)));
	if( &zBuf[nLen] - &zBuf[sizeof(pid_t)] >= (int)sizeof(struct timeval)  ){
		gettimeofday((struct timeval *)&zBuf[sizeof(pid_t)], 0);
	}
#else
	/* Fill with uninitialized data */
	SyMemcpy(zGarbage, zBuf, SXMIN(nLen, sizeof(zGarbage)));
#endif
	return SXRET_OK;
}